

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadEdgeList(OgreBinarySerializer *this,Mesh *param_1)

{
  StreamReader<false,_false> *pSVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  uint uVar5;
  uint uVar6;
  runtime_error *this_00;
  MemoryStreamReader *this_01;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar5;
    this_01 = this->m_reader;
    bVar9 = *(int *)&this_01->end == *(int *)&this_01->current;
    if (uVar3 == 0xb100 && !bVar9) {
      do {
        StreamReader<false,_false>::IncPtr(this_01,2);
        uVar2 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
        if (uVar2 == '\0') {
          StreamReader<false,_false>::IncPtr(this->m_reader,1);
          uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          uVar6 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          StreamReader<false,_false>::IncPtr(this->m_reader,(ulong)uVar5 * 0x30);
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
              uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
              this->m_currentLen = uVar5;
              if (uVar4 != 0xb110) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_48[0] = local_38;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_48,"M_EDGE_GROUP not found in M_EDGE_LIST_LOD","");
                std::runtime_error::runtime_error(this_00,(string *)local_48);
                *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
                __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              StreamReader<false,_false>::IncPtr(this->m_reader,0xc);
              uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
              if (uVar5 != 0) {
                uVar8 = (ulong)uVar5;
                do {
                  StreamReader<false,_false>::IncPtr(this->m_reader,0x19);
                  uVar8 = uVar8 - 1;
                } while (uVar8 != 0);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar6);
          }
        }
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
          uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
          uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar5;
        }
        this_01 = this->m_reader;
        bVar9 = *(int *)&this_01->end == *(int *)&this_01->current;
      } while ((!bVar9) && (uVar3 == 0xb100));
    }
    if (!bVar9) {
      StreamReader<false,_false>::IncPtr(this_01,-6);
      return;
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadEdgeList(Mesh * /*mesh*/)
{
    // Assimp does not acknowledge LOD levels as far as I can see it. This info is just skipped.

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_EDGE_LIST_LOD)
        {
            m_reader->IncPtr(sizeof(uint16_t)); // lod index
            bool manual = Read<bool>();

            if (!manual)
            {
                m_reader->IncPtr(sizeof(uint8_t));
                uint32_t numTriangles = Read<uint32_t>();
                uint32_t numEdgeGroups = Read<uint32_t>();

                size_t skipBytes = (sizeof(uint32_t) * 8 + sizeof(float) * 4) * numTriangles;
                m_reader->IncPtr(skipBytes);

                for (size_t i=0; i<numEdgeGroups; ++i)
                {
                    uint16_t id = ReadHeader();
                    if (id != M_EDGE_GROUP)
                        throw DeadlyImportError("M_EDGE_GROUP not found in M_EDGE_LIST_LOD");

                    m_reader->IncPtr(sizeof(uint32_t) * 3);
                    uint32_t numEdges = Read<uint32_t>();
                    for (size_t j=0; j<numEdges; ++j)
                    {
                        m_reader->IncPtr(sizeof(uint32_t) * 6 + sizeof(uint8_t));
                    }
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}